

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessageCommand.cxx
# Opt level: O1

bool __thiscall
cmMessageCommand::InitialPass
          (cmMessageCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pbVar1;
  pointer pbVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  cmake *this_00;
  MessageType t;
  string message;
  string local_80;
  char *local_60;
  undefined8 local_58;
  char local_50;
  undefined7 uStack_4f;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_40;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar2 == pbVar1) {
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == &local_80.field_2) goto LAB_00281073;
  }
  else {
    this_00 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
    iVar5 = std::__cxx11::string::compare((char *)pbVar1);
    if (iVar5 == 0) {
      t = FATAL_ERROR;
LAB_00280f32:
      local_40.Begin._M_current = pbVar1 + 1;
      bVar4 = false;
LAB_00280f3a:
      bVar3 = false;
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)pbVar1);
      if (iVar5 != 0) {
        iVar5 = std::__cxx11::string::compare((char *)pbVar1);
        if (iVar5 == 0) {
          t = WARNING;
          goto LAB_00280f32;
        }
        iVar5 = std::__cxx11::string::compare((char *)pbVar1);
        if (iVar5 == 0) {
          bVar3 = cmake::GetDevWarningsAsErrors(this_00,(this->super_cmCommand).Makefile);
          t = AUTHOR_ERROR;
          if (!bVar3) {
            bVar4 = cmake::GetSuppressDevWarnings(this_00,(this->super_cmCommand).Makefile);
            t = AUTHOR_WARNING;
LAB_00280fa3:
            if (bVar4 != false) goto LAB_00281073;
          }
          goto LAB_00280faf;
        }
        iVar5 = std::__cxx11::string::compare((char *)pbVar1);
        if (iVar5 == 0) {
          local_40.Begin._M_current = pbVar1 + 1;
          bVar4 = true;
          t = MESSAGE;
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)pbVar1);
          if (iVar5 == 0) {
            bVar3 = cmake::GetDeprecatedWarningsAsErrors(this_00,(this->super_cmCommand).Makefile);
            t = DEPRECATION_ERROR;
            if (!bVar3) {
              bVar4 = cmake::GetSuppressDeprecatedWarnings(this_00,(this->super_cmCommand).Makefile)
              ;
              t = DEPRECATION_WARNING;
              goto LAB_00280fa3;
            }
            goto LAB_00280faf;
          }
          t = MESSAGE;
          bVar4 = false;
          local_40.Begin._M_current = pbVar1;
        }
        goto LAB_00280f3a;
      }
      bVar3 = true;
      t = FATAL_ERROR;
LAB_00280faf:
      local_40.Begin._M_current = pbVar1 + 1;
      bVar4 = false;
    }
    local_40.End._M_current =
         (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    local_58 = 0;
    local_50 = '\0';
    local_60 = &local_50;
    cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              (&local_80,&local_40,&local_50);
    if (local_60 != &local_50) {
      operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
    }
    if (t == MESSAGE) {
      if (bVar4) {
        cmMakefile::DisplayStatus((this->super_cmCommand).Makefile,local_80._M_dataplus._M_p,-1.0);
      }
      else {
        cmSystemTools::Message(local_80._M_dataplus._M_p,(char *)0x0);
      }
    }
    else {
      cmMakefile::IssueMessage((this->super_cmCommand).Makefile,t,&local_80,true);
    }
    if (bVar3 != false) {
      cmSystemTools::s_FatalErrorOccured = true;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == &local_80.field_2) goto LAB_00281073;
  }
  operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
LAB_00281073:
  return pbVar2 != pbVar1;
}

Assistant:

bool cmMessageCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 1 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }
  std::vector<std::string>::const_iterator i = args.begin();

  cmake::MessageType type = cmake::MESSAGE;
  bool status = false;
  bool fatal = false;
  cmake* cm = this->Makefile->GetCMakeInstance();
  if (*i == "SEND_ERROR")
    {
    type = cmake::FATAL_ERROR;
    ++i;
    }
  else if (*i == "FATAL_ERROR")
    {
    fatal = true;
    type = cmake::FATAL_ERROR;
    ++i;
    }
  else if (*i == "WARNING")
    {
    type = cmake::WARNING;
    ++i;
    }
  else if (*i == "AUTHOR_WARNING")
    {
    if (cm->GetDevWarningsAsErrors(this->Makefile))
      {
      fatal = true;
      type = cmake::AUTHOR_ERROR;
      }
    else if (!cm->GetSuppressDevWarnings(this->Makefile))
      {
      type = cmake::AUTHOR_WARNING;
      }
    else
      {
      return true;
      }
    ++i;
    }
  else if (*i == "STATUS")
    {
    status = true;
    ++i;
    }
  else if (*i == "DEPRECATION")
    {
    if (cm->GetDeprecatedWarningsAsErrors(this->Makefile))
      {
      fatal = true;
      type = cmake::DEPRECATION_ERROR;
      }
    else if (!cm->GetSuppressDeprecatedWarnings(this->Makefile))
      {
      type = cmake::DEPRECATION_WARNING;
      }
    else
      {
      return true;
      }
    ++i;
    }

  std::string message = cmJoin(cmMakeRange(i, args.end()), std::string());

  if (type != cmake::MESSAGE)
    {
    // we've overriden the message type, above, so force IssueMessage to use it
    this->Makefile->IssueMessage(type, message, true);
    }
  else
    {
    if (status)
      {
      this->Makefile->DisplayStatus(message.c_str(), -1);
      }
    else
      {
      cmSystemTools::Message(message.c_str());
      }
    }
  if(fatal)
    {
    cmSystemTools::SetFatalErrorOccured();
    }
  return true;
}